

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::rewrite_load_for_wrapped_row_major
          (CompilerGLSL *this,string *expr,TypeID loaded_type,ID ptr)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  SPIRVariable *pSVar4;
  SPIRType *type_00;
  size_t sVar5;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  bool local_c9;
  char *local_c0;
  string local_b8;
  uint32_t local_98;
  undefined1 local_88 [8];
  Bitset decorations;
  uint32_t i;
  bool relaxed;
  bool rewrite;
  SPIRType *type;
  bool is_ubo;
  SPIRType *backing_type;
  SPIRVariable *var;
  string *expr_local;
  CompilerGLSL *this_local;
  ID ptr_local;
  TypeID loaded_type_local;
  
  this_local._0_4_ = ptr.id;
  this_local._4_4_ = loaded_type.id;
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this_local);
  pSVar4 = Compiler::maybe_get_backing_variable(&this->super_Compiler,uVar3);
  if (pSVar4 != (SPIRVariable *)0x0) {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar4->super_IVariant).field_0xc);
    _i = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar3);
    local_c9 = false;
    if ((_i->basetype == Struct) && (local_c9 = false, _i->storage == StorageClassUniform)) {
      local_c9 = Compiler::has_decoration
                           (&this->super_Compiler,(ID)(_i->super_IVariant).self.id,DecorationBlock);
    }
    if (local_c9 != false) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
      type_00 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar3);
      decorations.higher._M_h._M_single_bucket._7_1_ = 0;
      decorations.higher._M_h._M_single_bucket._6_1_ = (this->options).es & 1;
      bVar2 = Compiler::is_matrix(&this->super_Compiler,type_00);
      if (!bVar2) {
        decorations.higher._M_h._M_single_bucket._6_1_ = 0;
        _i = type_00;
      }
      if (_i->basetype == Struct) {
        for (decorations.higher._M_h._M_single_bucket._0_4_ = 0;
            uVar1 = (uint)decorations.higher._M_h._M_single_bucket,
            sVar5 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                              (&(_i->member_types).
                                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>),
            uVar1 < (uint)sVar5;
            decorations.higher._M_h._M_single_bucket._0_4_ =
                 (uint)decorations.higher._M_h._M_single_bucket + 1) {
          Compiler::combined_decoration_for_member
                    ((Bitset *)local_88,&this->super_Compiler,_i,
                     (uint)decorations.higher._M_h._M_single_bucket);
          bVar2 = Bitset::get((Bitset *)local_88,4);
          if (bVar2) {
            decorations.higher._M_h._M_single_bucket._7_1_ = 1;
          }
          in_stack_ffffffffffffff1f = Bitset::get((Bitset *)local_88,0);
          if (!(bool)in_stack_ffffffffffffff1f) {
            decorations.higher._M_h._M_single_bucket._6_1_ = 0;
          }
          Bitset::~Bitset((Bitset *)local_88);
        }
      }
      if ((decorations.higher._M_h._M_single_bucket._7_1_ & 1) != 0) {
        local_98 = this_local._4_4_;
        request_workaround_wrapper_overload(this,this_local._4_4_);
        local_c0 = "";
        if ((decorations.higher._M_h._M_single_bucket._6_1_ & 1) != 0) {
          local_c0 = "MP";
        }
        join<char_const(&)[22],char_const*,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                  (&local_b8,(spirv_cross *)"spvWorkaroundRowMajor",(char (*) [22])&local_c0,
                   (char **)0x4a488c,(char (*) [2])expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4b01ae,
                   (char (*) [2])CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
        ::std::__cxx11::string::operator=((string *)expr,(string *)&local_b8);
        ::std::__cxx11::string::~string((string *)&local_b8);
      }
    }
  }
  return;
}

Assistant:

void CompilerGLSL::rewrite_load_for_wrapped_row_major(std::string &expr, TypeID loaded_type, ID ptr)
{
	// Loading row-major matrices from UBOs on older AMD Windows OpenGL drivers is problematic.
	// To load these types correctly, we must first wrap them in a dummy function which only purpose is to
	// ensure row_major decoration is actually respected.
	auto *var = maybe_get_backing_variable(ptr);
	if (!var)
		return;

	auto &backing_type = get<SPIRType>(var->basetype);
	bool is_ubo = backing_type.basetype == SPIRType::Struct && backing_type.storage == StorageClassUniform &&
	              has_decoration(backing_type.self, DecorationBlock);
	if (!is_ubo)
		return;

	auto *type = &get<SPIRType>(loaded_type);
	bool rewrite = false;
	bool relaxed = options.es;

	if (is_matrix(*type))
	{
		// To avoid adding a lot of unnecessary meta tracking to forward the row_major state,
		// we will simply look at the base struct itself. It is exceptionally rare to mix and match row-major/col-major state.
		// If there is any row-major action going on, we apply the workaround.
		// It is harmless to apply the workaround to column-major matrices, so this is still a valid solution.
		// If an access chain occurred, the workaround is not required, so loading vectors or scalars don't need workaround.
		type = &backing_type;
	}
	else
	{
		// If we're loading a composite, we don't have overloads like these.
		relaxed = false;
	}

	if (type->basetype == SPIRType::Struct)
	{
		// If we're loading a struct where any member is a row-major matrix, apply the workaround.
		for (uint32_t i = 0; i < uint32_t(type->member_types.size()); i++)
		{
			auto decorations = combined_decoration_for_member(*type, i);
			if (decorations.get(DecorationRowMajor))
				rewrite = true;

			// Since we decide on a per-struct basis, only use mediump wrapper if all candidates are mediump.
			if (!decorations.get(DecorationRelaxedPrecision))
				relaxed = false;
		}
	}

	if (rewrite)
	{
		request_workaround_wrapper_overload(loaded_type);
		expr = join("spvWorkaroundRowMajor", (relaxed ? "MP" : ""), "(", expr, ")");
	}
}